

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O2

void coll_tmap_clear(coll_tmap_t *map)

{
  entry_t_conflict *entry;
  coll_seq_t seq;
  coll_seq_t cStack_28;
  
  coll_seq_init(&cStack_28);
  for (entry = entry_last(map->root); entry != (entry_t_conflict *)0x0; entry = entry_prev(entry)) {
    coll_seq_prepend(&cStack_28,entry);
  }
  coll_seq_foreach(&cStack_28,free);
  coll_seq_free(&cStack_28);
  map->root = (coll_tmap_entry_t *)0x0;
  map->size = 0;
  return;
}

Assistant:

void coll_tmap_clear(coll_tmap_t *map) {
    coll_seq_t seq;
    coll_seq_init(&seq);
    entry_t *cur = entry_last(map->root);
    while (cur) {
        coll_seq_prepend(&seq, cur);
        cur = entry_prev(cur);
    }
    coll_seq_foreach(&seq, free);
    coll_seq_free(&seq);
    map->root = NULL;
    map->size = 0;
}